

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData160 * cfd::core::HashUtil::Hash160(ByteData160 *__return_storage_ptr__,Pubkey *pubkey)

{
  ByteData local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  Pubkey *local_18;
  Pubkey *pubkey_local;
  
  local_18 = pubkey;
  pubkey_local = (Pubkey *)__return_storage_ptr__;
  Pubkey::GetData(&local_48,pubkey);
  ByteData::GetBytes(&local_30,&local_48);
  Hash160(__return_storage_ptr__,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  ByteData::~ByteData(&local_48);
  return __return_storage_ptr__;
}

Assistant:

ByteData160 HashUtil::Hash160(const Pubkey &pubkey) {
  return Hash160(pubkey.GetData().GetBytes());
}